

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrestaccessmanager.cpp
# Opt level: O0

void __thiscall
QRestAccessManagerPrivate::verifyThreadAffinity
          (QRestAccessManagerPrivate *this,QObject *contextObject)

{
  bool bVar1;
  QMessageLogger *this_00;
  char *file;
  char *pcVar2;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *this_01;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *pQVar3;
  long in_RSI;
  QRestAccessManagerPrivate *in_RDI;
  long in_FS_OFFSET;
  QRestAccessManager *q;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff68;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *in_stack_ffffffffffffff70;
  char local_68 [32];
  char local_48 [32];
  undefined8 local_28;
  ulong local_20;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QMessageLogger *)q_func(in_RDI);
  file = (char *)QThread::currentThread();
  pcVar2 = (char *)QObject::thread();
  if (file != pcVar2) {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcQrest();
    anon_unknown.dwarf_7e2df3::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_7e2df3::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x32c43d);
      QMessageLogger::QMessageLogger
                (this_00,file,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                 (char *)in_stack_ffffffffffffff68,(char *)0x32c453);
      QMessageLogger::warning
                (local_48,"QRestAccessManager can only be called in the thread it belongs to");
      local_10 = local_10 & 0xffffffffffffff00;
    }
  }
  if (in_RSI != 0) {
    this_01 = (QLoggingCategoryMacroHolder<(QtMsgType)1> *)QObject::thread();
    pQVar3 = (QLoggingCategoryMacroHolder<(QtMsgType)1> *)QObject::thread();
    if (this_01 != pQVar3) {
      local_28 = 0xaaaaaaaaaaaaaaaa;
      local_20 = 0xaaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcQrest();
      anon_unknown.dwarf_7e2df3::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder(this_01,in_stack_ffffffffffffff68);
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
        anon_unknown.dwarf_7e2df3::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x32c4e8);
        QMessageLogger::QMessageLogger
                  (this_00,file,(int)((ulong)this_01 >> 0x20),(char *)in_stack_ffffffffffffff68,
                   (char *)0x32c4fe);
        QMessageLogger::warning
                  (local_68,"QRestAccessManager: the context object must reside in the same thread")
        ;
        local_20 = local_20 & 0xffffffffffffff00;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRestAccessManagerPrivate::verifyThreadAffinity(const QObject *contextObject)
{
    Q_Q(QRestAccessManager);
    if (QThread::currentThread() != q->thread()) {
        qCWarning(lcQrest, "QRestAccessManager can only be called in the thread it belongs to");
        Q_ASSERT(false);
    }
    if (contextObject && (contextObject->thread() != q->thread())) {
        qCWarning(lcQrest, "QRestAccessManager: the context object must reside in the same thread");
        Q_ASSERT(false);
    }
}